

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

void __thiscall gl4cts::ShaderSubroutine::NegativeTest1::initTest(NegativeTest1 *this)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  GLint GVar4;
  undefined4 extraout_var;
  TestError *this_00;
  GLint link_status;
  GLint compile_status;
  char *vs_body;
  int local_30;
  int local_2c;
  char *local_28;
  long lVar5;
  
  local_2c = 0;
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  GVar2 = (**(code **)(lVar5 + 0x3c8))();
  this->m_po_not_linked_id = GVar2;
  GVar2 = (**(code **)(lVar5 + 0x3c8))();
  this->m_po_id = GVar2;
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glCreateProgram() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x298d);
  GVar2 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar2;
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glCreateShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2991);
  local_28 = 
  "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nsubroutine void subroutineType (out ivec2 arg);\nsubroutine void subroutineType2(out ivec4 arg);\n\nsubroutine(subroutineType) void test1(out ivec2 arg)\n{\n    arg = ivec2(1, 2);\n}\nsubroutine(subroutineType) void test2(out ivec2 arg)\n{\n    arg = ivec2(3,4);\n}\nsubroutine(subroutineType2) void test3(out ivec4 arg)\n{\n    arg = ivec4(1, 2, 3, 4);\n}\n\nsubroutine uniform subroutineType  function;\nsubroutine uniform subroutineType2 function2;\n\nvoid main()\n{\n    ivec2 test;\n    ivec4 test2;\n\n    function(test);\n\n    if (test.x > 2)\n    {\n        gl_Position = vec4(1);\n    }\n    else\n    {\n        function2(test2);\n\n        gl_Position = vec4(float(test2.x) );\n    }\n}\n"
  ;
  (**(code **)(lVar5 + 0x12b8))(this->m_vs_id,1,&local_28,0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glShaderSource() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x29bf);
  (**(code **)(lVar5 + 0x248))(this->m_vs_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glCompileShader() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x29c2);
  (**(code **)(lVar5 + 0xa70))(this->m_vs_id,0x8b81,&local_2c);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glGetShaderiv() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x29c5);
  if (local_2c == 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x29c9);
  }
  else {
    local_30 = 0;
    (**(code **)(lVar5 + 0x10))(this->m_po_id,this->m_vs_id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glAttachShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x29d0);
    (**(code **)(lVar5 + 0xce8))(this->m_po_id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glLinkProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x29d3);
    (**(code **)(lVar5 + 0x9d8))(this->m_po_id,0x8b82,&local_30);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glGetProgramiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x29d6);
    if (local_30 == 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Program linking failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x29da);
    }
    else {
      (**(code **)(lVar5 + 0x9d0))
                (this->m_po_id,0x8b31,0x8e47,&this->m_po_active_subroutine_uniform_locations);
      (**(code **)(lVar5 + 0x9d0))
                (this->m_po_id,0x8b31,0x8de6,&this->m_po_active_subroutine_uniforms);
      (**(code **)(lVar5 + 0x9d0))(this->m_po_id,0x8b31,0x8de5,&this->m_po_active_subroutines);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"glGetProgramStageiv() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x29e2);
      if (this->m_po_active_subroutine_uniform_locations == 2) {
        GVar2 = (**(code **)(lVar5 + 0xa88))(this->m_po_id,0x8b31,"test1");
        this->m_po_subroutine_test1_index = GVar2;
        GVar2 = (**(code **)(lVar5 + 0xa88))(this->m_po_id,0x8b31,"test2");
        this->m_po_subroutine_test2_index = GVar2;
        GVar2 = (**(code **)(lVar5 + 0xa88))(this->m_po_id,0x8b31,"test3");
        this->m_po_subroutine_test3_index = GVar2;
        dVar3 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar3,"glGetSubroutineIndex() call(s) failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                        ,0x29ec);
        if (((this->m_po_subroutine_test1_index == 0xffffffff) ||
            (this->m_po_subroutine_test2_index == 0xffffffff)) ||
           (this->m_po_subroutine_test3_index == 0xffffffff)) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Invalid subroutine index returned",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                     ,0x29f1);
        }
        else {
          GVar4 = (**(code **)(lVar5 + 0xa90))(this->m_po_id,0x8b31,"function");
          this->m_po_subroutine_uniform_function_index = GVar4;
          GVar4 = (**(code **)(lVar5 + 0xa90))(this->m_po_id,0x8b31,"function2");
          this->m_po_subroutine_uniform_function2_index = GVar4;
          dVar3 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar3,"glGetSubroutineUniformLocation() call(s) failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                          ,0x29f6);
          if ((this->m_po_subroutine_uniform_function_index != -1) &&
             (this->m_po_subroutine_uniform_function2_index != -1)) {
            return;
          }
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Invalid subroutine uniform index returned",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                     ,0x29fa);
        }
      }
      else {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Invalid GL_ACTIVE_SUBROUTINE_UNIFORM_LOCATIONS value returned",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                   ,0x29e6);
      }
    }
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void NegativeTest1::initTest()
{
	glw::GLint			  compile_status = GL_FALSE;
	const glw::Functions& gl			 = m_context.getRenderContext().getFunctions();

	/* Create program objects */
	m_po_not_linked_id = gl.createProgram();
	m_po_id			   = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call(s) failed.");

	/* Create vertex shader object */
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

	/* Set up vertex shader */
	const char* vs_body = "#version 400\n"
						  "\n"
						  "#extension GL_ARB_shader_subroutine : require\n"
						  "\n"
						  "subroutine void subroutineType (out ivec2 arg);\n"
						  "subroutine void subroutineType2(out ivec4 arg);\n"
						  "\n"
						  "subroutine(subroutineType) void test1(out ivec2 arg)\n"
						  "{\n"
						  "    arg = ivec2(1, 2);\n"
						  "}\n"
						  "subroutine(subroutineType) void test2(out ivec2 arg)\n"
						  "{\n"
						  "    arg = ivec2(3,4);\n"
						  "}\n"
						  "subroutine(subroutineType2) void test3(out ivec4 arg)\n"
						  "{\n"
						  "    arg = ivec4(1, 2, 3, 4);\n"
						  "}\n"
						  "\n"
						  "subroutine uniform subroutineType  function;\n"
						  "subroutine uniform subroutineType2 function2;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    ivec2 test;\n"
						  "    ivec4 test2;\n"
						  "\n"
						  "    function(test);\n"
						  "\n"
						  "    if (test.x > 2)\n"
						  "    {\n"
						  "        gl_Position = vec4(1);\n"
						  "    }\n"
						  "    else\n"
						  "    {\n"
						  "        function2(test2);\n"
						  "\n"
						  "        gl_Position = vec4(float(test2.x) );\n"
						  "    }\n"
						  "}\n";

	gl.shaderSource(m_vs_id, 1 /* count */, &vs_body, DE_NULL /* length */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed");

	gl.compileShader(m_vs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed");

	gl.getShaderiv(m_vs_id, GL_COMPILE_STATUS, &compile_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed");

	if (compile_status == GL_FALSE)
	{
		TCU_FAIL("Shader compilation failed");
	}

	/* Set up & link the test program object */
	glw::GLint link_status = GL_FALSE;

	gl.attachShader(m_po_id, m_vs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call failed.");

	gl.linkProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

	gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status == GL_FALSE)
	{
		TCU_FAIL("Program linking failed");
	}

	/* Query test program object's properties */
	gl.getProgramStageiv(m_po_id, GL_VERTEX_SHADER, GL_ACTIVE_SUBROUTINE_UNIFORM_LOCATIONS,
						 &m_po_active_subroutine_uniform_locations);
	gl.getProgramStageiv(m_po_id, GL_VERTEX_SHADER, GL_ACTIVE_SUBROUTINE_UNIFORMS, &m_po_active_subroutine_uniforms);
	gl.getProgramStageiv(m_po_id, GL_VERTEX_SHADER, GL_ACTIVE_SUBROUTINES, &m_po_active_subroutines);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramStageiv() call(s) failed.");

	if (m_po_active_subroutine_uniform_locations != 2)
	{
		TCU_FAIL("Invalid GL_ACTIVE_SUBROUTINE_UNIFORM_LOCATIONS value returned");
	}

	m_po_subroutine_test1_index = gl.getSubroutineIndex(m_po_id, GL_VERTEX_SHADER, "test1");
	m_po_subroutine_test2_index = gl.getSubroutineIndex(m_po_id, GL_VERTEX_SHADER, "test2");
	m_po_subroutine_test3_index = gl.getSubroutineIndex(m_po_id, GL_VERTEX_SHADER, "test3");
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSubroutineIndex() call(s) failed.");

	if (m_po_subroutine_test1_index == GL_INVALID_INDEX || m_po_subroutine_test2_index == GL_INVALID_INDEX ||
		m_po_subroutine_test3_index == GL_INVALID_INDEX)
	{
		TCU_FAIL("Invalid subroutine index returned");
	}

	m_po_subroutine_uniform_function_index  = gl.getSubroutineUniformLocation(m_po_id, GL_VERTEX_SHADER, "function");
	m_po_subroutine_uniform_function2_index = gl.getSubroutineUniformLocation(m_po_id, GL_VERTEX_SHADER, "function2");
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSubroutineUniformLocation() call(s) failed.");

	if (m_po_subroutine_uniform_function_index == -1 || m_po_subroutine_uniform_function2_index == -1)
	{
		TCU_FAIL("Invalid subroutine uniform index returned");
	}
}